

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_double_path.cpp
# Opt level: O0

double __thiscall
agg::trans_double_path::finalize_path(trans_double_path *this,vertex_storage *vertices)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  vertex_dist *pvVar4;
  vertex_dist *pvVar5;
  vertex_dist *v;
  double d;
  double dist;
  uint i;
  vertex_storage *vertices_local;
  trans_double_path *this_local;
  
  vertex_sequence<agg::vertex_dist,_6U>::close(vertices,0);
  uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                    (&vertices->super_pod_bvector<agg::vertex_dist,_6U>);
  if (2 < uVar3) {
    uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                      (&vertices->super_pod_bvector<agg::vertex_dist,_6U>);
    pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                       (&vertices->super_pod_bvector<agg::vertex_dist,_6U>,uVar3 - 2);
    dVar1 = pvVar4->dist;
    uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                      (&vertices->super_pod_bvector<agg::vertex_dist,_6U>);
    pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                       (&vertices->super_pod_bvector<agg::vertex_dist,_6U>,uVar3 - 3);
    if (dVar1 * 10.0 < pvVar4->dist) {
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&vertices->super_pod_bvector<agg::vertex_dist,_6U>);
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&vertices->super_pod_bvector<agg::vertex_dist,_6U>,uVar3 - 3);
      dVar1 = pvVar4->dist;
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&vertices->super_pod_bvector<agg::vertex_dist,_6U>);
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&vertices->super_pod_bvector<agg::vertex_dist,_6U>,uVar3 - 2);
      dVar2 = pvVar4->dist;
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&vertices->super_pod_bvector<agg::vertex_dist,_6U>);
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&vertices->super_pod_bvector<agg::vertex_dist,_6U>,uVar3 - 1);
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&vertices->super_pod_bvector<agg::vertex_dist,_6U>);
      pvVar5 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&vertices->super_pod_bvector<agg::vertex_dist,_6U>,uVar3 - 2);
      pvVar5->x = pvVar4->x;
      pvVar5->y = pvVar4->y;
      pvVar5->dist = pvVar4->dist;
      pod_bvector<agg::vertex_dist,_6U>::remove_last
                (&vertices->super_pod_bvector<agg::vertex_dist,_6U>);
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&vertices->super_pod_bvector<agg::vertex_dist,_6U>);
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         (&vertices->super_pod_bvector<agg::vertex_dist,_6U>,uVar3 - 2);
      pvVar4->dist = dVar1 + dVar2;
    }
  }
  d = 0.0;
  for (dist._4_4_ = 0;
      uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                        (&vertices->super_pod_bvector<agg::vertex_dist,_6U>), dist._4_4_ < uVar3;
      dist._4_4_ = dist._4_4_ + 1) {
    pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                       (&vertices->super_pod_bvector<agg::vertex_dist,_6U>,dist._4_4_);
    dVar1 = pvVar4->dist;
    pvVar4->dist = d;
    d = dVar1 + d;
  }
  uVar3 = pod_bvector<agg::vertex_dist,_6U>::size
                    (&vertices->super_pod_bvector<agg::vertex_dist,_6U>);
  return (double)(uVar3 - 1) / d;
}

Assistant:

double trans_double_path::finalize_path(vertex_storage& vertices)
    {
        unsigned i;
        double dist;
        double d;

        vertices.close(false);
        if(vertices.size() > 2)
        {
            if(vertices[vertices.size() - 2].dist * 10.0 < 
               vertices[vertices.size() - 3].dist)
            {
                d = vertices[vertices.size() - 3].dist + 
                    vertices[vertices.size() - 2].dist;

                vertices[vertices.size() - 2] = 
                    vertices[vertices.size() - 1];

                vertices.remove_last();
                vertices[vertices.size() - 2].dist = d;
            }
        }

        dist = 0;
        for(i = 0; i < vertices.size(); i++)
        {
            vertex_dist& v = vertices[i];
            d = v.dist;
            v.dist = dist;
            dist += d;
        }

        return (vertices.size() - 1) / dist;
    }